

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v5::vprint<wchar_t>
               (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,
               basic_string_view<wchar_t> format_str,
               basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               args)

{
  iterator this;
  basic_buffer<wchar_t> *in_RCX;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *in_R8;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  allocator<wchar_t> *in_stack_fffffffffffff788;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_stack_fffffffffffff790;
  basic_buffer<wchar_t> *in_stack_fffffffffffff7c8;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  in_stack_fffffffffffff7d0;
  basic_string_view<wchar_t> in_stack_fffffffffffff7e0;
  
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            (in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&stack0xfffffffffffff7e7);
  this = internal::vformat_to<wchar_t>
                   (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d0);
  internal::write<wchar_t>(in_R8,in_RCX);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
            ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)this.container);
  return;
}

Assistant:

inline void vprint(std::basic_ostream<Char> &os,
                   basic_string_view<Char> format_str,
                   basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  internal::write(os, buffer);
}